

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupSelectedOutputs(Gia_Man_t *p,Vec_Int_t *vOutsLeft)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x12e,"Gia_Man_t *Gia_ManDupSelectedOutputs(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->vCos->nSize < vOutsLeft->nSize) {
    __assert_fail("Gia_ManPoNum(p) >= Vec_IntSize(vOutsLeft)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x12f,"Gia_Man_t *Gia_ManDupSelectedOutputs(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize - p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  for (iVar5 = 0; iVar2 = vOutsLeft->nSize, iVar5 < iVar2; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(vOutsLeft,iVar5);
    pGVar4 = Gia_ManPo(p,iVar2);
    Gia_ManDupOrderDfs_rec(p_00,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
  }
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(vOutsLeft,iVar5);
    pGVar4 = Gia_ManPo(p,iVar2);
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    Gia_ManAppendCo(p_00,iVar2);
    iVar2 = vOutsLeft->nSize;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupSelectedOutputs( Gia_Man_t * p, Vec_Int_t * vOutsLeft )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iOut;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) >= Vec_IntSize(vOutsLeft) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_IntForEachEntry( vOutsLeft, iOut, i )
        Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(Gia_ManPo(p, iOut)) );
    Vec_IntForEachEntry( vOutsLeft, iOut, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, iOut)) );
    return pNew;
}